

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthStencilTexturesTest::iterate
          (MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthStencilTexturesTest *this)

{
  undefined1 uVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  long lVar7;
  TestError *this_00;
  undefined8 uVar8;
  bool bVar9;
  GLint gl_max_internalformat_samples_value;
  GLint gl_max_samples_value;
  GLint gl_max_depth_texture_samples_value;
  int local_40;
  uint local_3c;
  undefined4 local_38;
  undefined4 local_34;
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  local_34 = 0xffffffff;
  local_40 = -1;
  local_38 = 0xffffffff;
  uVar8 = CONCAT71((int7)((ulong)&local_38 >> 8),1);
  lVar7 = 0;
  do {
    local_3c = (uint)uVar8;
    uVar2 = (&depth_stencil_renderable_internalformats)[lVar7];
    lVar7 = 0;
    bVar3 = true;
    do {
      bVar9 = bVar3;
      uVar1 = (&DAT_01aede00)[lVar7];
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
      (**(code **)(lVar6 + 0x868))(0x8d57,&local_38);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"Failed to retrieve GL_MAX_SAMPLES value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x44f);
      (**(code **)(lVar6 + 0x868))(0x910f,&local_34);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"Failed to retrieve GL_MAX_DEPTH_TEXTURE_SAMPLES value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x454);
      (**(code **)(lVar6 + 0x880))(0x9100,uVar2,0x80a9,1,&local_40);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glGetInternalformativ() failed to retrieve GL_SAMPLES",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x459);
      (**(code **)(lVar6 + 0x1390))(0x9100,local_40 + 1,uVar2,1,1,uVar1);
      iVar4 = (**(code **)(lVar6 + 0x800))();
      if (iVar4 != 0x502) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,
                   "glTexStorage2DMultisample() did not generate GL_INVALID_OPERATION error.",
                   "gl.getError() == GL_INVALID_OPERATION",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                   ,0x461);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
      lVar7 = 1;
      bVar3 = false;
    } while (bVar9);
    uVar8 = 0;
  } while ((local_3c & 1) != 0);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthStencilTexturesTest::iterate()
{
	/* Test case variables */
	const glw::GLboolean fixedsamplelocations_list[] = { GL_FALSE, GL_TRUE };
	const int			 fixedsamplelocations_list_count =
		sizeof(fixedsamplelocations_list) / sizeof(fixedsamplelocations_list[0]);
	const glw::Functions& gl								  = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_depth_texture_samples_value  = -1; /* Will be determined later */
	glw::GLint			  gl_max_internalformat_samples_value = -1; /* Will be determined later */
	glw::GLint			  gl_max_samples_value				  = -1; /* Will be determined later */
	const glw::GLsizei	height							  = 1;
	const glw::GLenum	 internalformat_list[]				  = { GL_DEPTH24_STENCIL8, GL_DEPTH32F_STENCIL8 };
	const int			  internalformat_list_count = sizeof(internalformat_list) / sizeof(internalformat_list[0]);
	const glw::GLenum	 target = GL_TEXTURE_2D_MULTISAMPLE; /* Test case uses GL_TEXTURE_2D_MULTISAMPLE target */
	const glw::GLsizei	width  = 1;

	/* Iterate through all internal formats test case should check */
	for (int internalformat_index = 0; internalformat_index < internalformat_list_count; internalformat_index++)
	{
		/* Iteration-specific internalformat */
		glw::GLenum internalformat = internalformat_list[internalformat_index];

		/* Iterate through all fixedsamplelocations test case should check */
		for (int fixedsamplelocations_index = 0; fixedsamplelocations_index < fixedsamplelocations_list_count;
			 fixedsamplelocations_index++)
		{
			/* Iteration-specific fixedsamplelocations */
			glw::GLboolean fixedsamplelocations = fixedsamplelocations_list[fixedsamplelocations_index];

			/* Initialize texture object and bind it to GL_TEXTURE_2D_MULTISAMPLE target */
			initInternalIteration();

			/* Get GL_MAX_SAMPLES value */
			gl.getIntegerv(GL_MAX_SAMPLES, &gl_max_samples_value);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to retrieve GL_MAX_SAMPLES value");

			/* Get GL_MAX_DEPTH_TEXTURE_SAMPLES value */
			gl.getIntegerv(GL_MAX_DEPTH_TEXTURE_SAMPLES, &gl_max_depth_texture_samples_value);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to retrieve GL_MAX_DEPTH_TEXTURE_SAMPLES value");

			/* Retrieve maximum amount of samples available for the texture target considered */
			gl.getInternalformativ(target, internalformat, GL_SAMPLES, 1, &gl_max_internalformat_samples_value);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed to retrieve GL_SAMPLES");

			/* Issue call with valid parameters, but samples argument might be invalid */
			gl.texStorage2DMultisample(target, gl_max_internalformat_samples_value + 1, internalformat, width, height,
									   fixedsamplelocations);

			/* Expect GL_INVALID_OPERATION error code. */
			TCU_CHECK_MSG(gl.getError() == GL_INVALID_OPERATION,
						  "glTexStorage2DMultisample() did not generate GL_INVALID_OPERATION error.");

			/* Deinitialize texture object and unbind texture object bound to GL_TEXTURE_2D_MULTISAMPLE target */
			deinitInternalIteration();
		}
	}

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}